

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::DEY(CPU *this)

{
  byte bVar1;
  uint8_t uVar2;
  
  uVar2 = this->Y + 0xff;
  this->Y = uVar2;
  if (uVar2 == '\0') {
    bVar1 = this->field_0x2e | 0x40;
  }
  else {
    bVar1 = this->field_0x2e & 0xbf;
    if ((char)uVar2 < '\0') {
      bVar1 = bVar1 | 1;
      goto LAB_00110007;
    }
  }
  bVar1 = bVar1 & 0xfe;
LAB_00110007:
  this->field_0x2e = bVar1;
  return;
}

Assistant:

void CPU::DEY() {
	Y--;
	if (Y == 0) {
		Z = 1;
	} else {
		Z = 0;
	}
	if (Y & (1 << 7)) {
		N = 1;
	} else {
		N = 0;
	}
}